

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLPrinter::Write(XMLPrinter *this,char *data,size_t size)

{
  char *pcVar1;
  
  if ((FILE *)this->_fp != (FILE *)0x0) {
    fwrite(data,1,size,(FILE *)this->_fp);
    return;
  }
  pcVar1 = DynArray<char,_20>::PushArr(&this->_buffer,(int)size);
  memcpy(pcVar1 + -1,data,size);
  pcVar1[size - 1] = '\0';
  return;
}

Assistant:

void XMLPrinter::Write( const char* data, size_t size )
{
    if ( _fp ) {
        fwrite ( data , sizeof(char), size, _fp);
    }
    else {
        char* p = _buffer.PushArr( static_cast<int>(size) ) - 1;   // back up over the null terminator.
        memcpy( p, data, size );
        p[size] = 0;
    }
}